

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_word.cpp
# Opt level: O0

wstring * __thiscall BmsWord::ToWString_abi_cxx11_(wstring *__return_storage_ptr__,BmsWord *this)

{
  allocator<wchar_t> local_49;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  BmsWord local_38 [2];
  string s;
  BmsWord *this_local;
  
  ToString_abi_cxx11_(local_38);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::end();
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((wstring *)__return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<wchar_t>::~allocator(&local_49);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::wstring
BmsWord::ToWString(void) const
{
	std::string s = ToString();
	return std::wstring(s.begin(), s.end());
}